

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

Bool IsImage(ctmbstr iType)

{
  Bool BVar1;
  int iVar2;
  uint maxExt;
  long lVar3;
  tmbchar ext [20];
  tmbchar atStack_38 [32];
  
  BVar1 = IsFilePath(iType);
  if (BVar1 != no) {
    GetFileExtension(iType,atStack_38,maxExt);
    lVar3 = 0;
    do {
      iVar2 = prvTidytmbstrcasecmp
                        (atStack_38,
                         (ctmbstr)((long)&imageExtensions_rel +
                                  (long)*(int *)((long)&imageExtensions_rel + lVar3)));
      if (iVar2 == 0) {
        return yes;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x34);
  }
  return no;
}

Assistant:

static Bool IsImage( ctmbstr iType )
{
    uint i;
    tmbchar ext[20];

    if ( !IsFilePath(iType) ) return 0;

    GetFileExtension( iType, ext, sizeof(ext) );

    /* Compare it to the array of known image file extensions */
    for (i = 0; i < N_IMAGE_EXTS; i++)
    {
        if ( TY_(tmbstrcasecmp)(ext, imageExtensions[i]) == 0 )
            return yes;
    }
    
    return no;
}